

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O1

void display_area(wchar_t *text,uint8_t *attrs,size_t *line_starts,size_t *line_lengths,
                 size_t n_lines,region_conflict area,size_t line_from)

{
  long lVar1;
  wchar_t y;
  ulong uVar2;
  ulong uVar3;
  
  if ((ulong)(long)area.page_rows < n_lines) {
    n_lines = (long)area.page_rows;
  }
  if (n_lines != 0) {
    uVar3 = 0;
    do {
      y = area.row + (int)uVar3;
      Term_erase(area.col,y,area.width);
      lVar1 = uVar3 + line_from;
      if (line_lengths[lVar1] != 0) {
        uVar2 = 0;
        do {
          Term_putch(area.col + (int)uVar2,y,(uint)attrs[uVar2 + line_starts[lVar1]],
                     text[line_starts[lVar1] + uVar2]);
          uVar2 = uVar2 + 1;
        } while (uVar2 < line_lengths[lVar1]);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != n_lines);
  }
  return;
}

Assistant:

static void display_area(const wchar_t *text, const uint8_t *attrs,
		size_t *line_starts, size_t *line_lengths,
		size_t n_lines,
		region area, size_t line_from)
{
	size_t i, j;

	n_lines = MIN(n_lines, (size_t) area.page_rows);

	for (i = 0; i < n_lines; i++) {
		Term_erase(area.col, area.row + i, area.width);
		for (j = 0; j < line_lengths[line_from + i]; j++) {
			Term_putch(area.col + j, area.row + i,
					attrs[line_starts[line_from + i] + j],
					text[line_starts[line_from + i] + j]);
		}
	}
}